

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O2

char * checkhome(char *home,char *fname,_Bool dotscore)

{
  int __fd;
  char *__file;
  char *pcVar1;
  undefined7 in_register_00000011;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((CONCAT71(in_register_00000011,dotscore) & 0xffffffff) + 1 == lVar2) {
      return (char *)0x0;
    }
    if (dotscore) {
      __file = (char *)curl_maprintf("%s/%c%s",home,(int)(char)(&DAT_00121a92)[lVar2],fname + 1);
    }
    else {
      __file = (char *)curl_maprintf("%s/%s",home,fname);
    }
    if (__file != (char *)0x0) {
      __fd = open64(__file,0);
      if (-1 < __fd) {
        pcVar1 = strdup(__file);
        close(__fd);
        curl_free(__file);
        return pcVar1;
      }
      curl_free(__file);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static char *checkhome(const char *home, const char *fname, bool dotscore)
{
  const char pref[2] = { '.', '_' };
  int i;
  for(i = 0; i < (dotscore ? 2 : 1); i++) {
    char *c;
    if(dotscore)
      c = aprintf("%s" DIR_CHAR "%c%s", home, pref[i], &fname[1]);
    else
      c = aprintf("%s" DIR_CHAR "%s", home, fname);
    if(c) {
      int fd = open(c, O_RDONLY);
      if(fd >= 0) {
        char *path = strdup(c);
        close(fd);
        curl_free(c);
        return path;
      }
      curl_free(c);
    }
  }
  return NULL;
}